

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::LocalRedundancyEliminationPass::Process(LocalRedundancyEliminationPass *this)

{
  _Rb_tree_header *p_Var1;
  Module *pMVar2;
  pointer puVar3;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var4;
  undefined8 *puVar5;
  bool bVar6;
  Status SVar7;
  pointer puVar8;
  byte bVar9;
  byte bVar10;
  undefined8 *puVar11;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  value_to_ids;
  ValueNumberTable vnTable;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_e0;
  ValueNumberTable local_b0;
  
  local_b0.context_ = (this->super_Pass).context_;
  local_b0.instruction_to_value_._M_h._M_buckets =
       &local_b0.instruction_to_value_._M_h._M_single_bucket;
  local_b0.instruction_to_value_._M_h._M_bucket_count = 1;
  local_b0.instruction_to_value_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.instruction_to_value_._M_h._M_element_count = 0;
  local_b0.instruction_to_value_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0.instruction_to_value_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0.instruction_to_value_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.id_to_value_._M_h._M_buckets = &local_b0.id_to_value_._M_h._M_single_bucket;
  local_b0.id_to_value_._M_h._M_bucket_count = 1;
  local_b0.id_to_value_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.id_to_value_._M_h._M_element_count = 0;
  local_b0.id_to_value_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0.id_to_value_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0.id_to_value_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.next_value_number_ = 1;
  ValueNumberTable::BuildDominatorTreeValueNumberTable(&local_b0);
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar8 = *(pointer *)
            &(pMVar2->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar3 = *(pointer *)
            ((long)&(pMVar2->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  if (puVar8 == puVar3) {
    SVar7 = SuccessWithoutChange;
  }
  else {
    p_Var1 = &local_e0._M_impl.super__Rb_tree_header;
    bVar10 = 0;
    bVar9 = 0;
    do {
      _Var4.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
           (puVar8->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
      ;
      puVar5 = *(undefined8 **)
                ((long)_Var4.
                       super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                       .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0xa0)
      ;
      for (puVar11 = *(undefined8 **)
                      ((long)_Var4.
                             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl +
                      0x98); puVar11 != puVar5; puVar11 = puVar11 + 1) {
        local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        bVar6 = EliminateRedundanciesInBB
                          (this,(BasicBlock *)*puVar11,&local_b0,
                           (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)&local_e0);
        if (bVar6) {
          bVar10 = 1;
        }
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::_M_erase(&local_e0,(_Link_type)local_e0._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        bVar9 = bVar10;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
    SVar7 = bVar9 ^ SuccessWithoutChange;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b0.id_to_value_._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_b0);
  return SVar7;
}

Assistant:

Pass::Status LocalRedundancyEliminationPass::Process() {
  bool modified = false;
  ValueNumberTable vnTable(context());

  for (auto& func : *get_module()) {
    for (auto& bb : func) {
      // Keeps track of all ids that contain a given value number. We keep
      // track of multiple values because they could have the same value, but
      // different decorations.
      std::map<uint32_t, uint32_t> value_to_ids;
      if (EliminateRedundanciesInBB(&bb, vnTable, &value_to_ids))
        modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}